

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O3

unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>
wabt::MakeUnique<wabt::BrTableExpr>(void)

{
  undefined8 *puVar1;
  __uniq_ptr_data<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>,_true,_true> in_RDI;
  Location LStack_38;
  
  puVar1 = (undefined8 *)operator_new(0xa0);
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined8 *)((long)puVar1 + 0x24) = 0;
  *(undefined8 *)((long)puVar1 + 0x2c) = 0;
  *(undefined4 *)(puVar1 + 7) = 0xb;
  *puVar1 = &PTR__BrTableExpr_0019cfe8;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  LStack_38.field_1.field_0.line = 0;
  LStack_38.field_1._4_8_ = 0;
  LStack_38.filename.data_ = (char *)0x0;
  LStack_38.filename.size_._0_4_ = 0;
  LStack_38.filename.size_._4_4_ = 0;
  Var::Var((Var *)(puVar1 + 0xb),0xffffffff,&LStack_38);
  *(undefined8 **)
   in_RDI.super___uniq_ptr_impl<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>._M_t.
   super__Tuple_impl<0UL,_wabt::BrTableExpr_*,_std::default_delete<wabt::BrTableExpr>_>.
   super__Head_base<0UL,_wabt::BrTableExpr_*,_false>._M_head_impl = puVar1;
  return (__uniq_ptr_data<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>,_true,_true>)
         (tuple<wabt::BrTableExpr_*,_std::default_delete<wabt::BrTableExpr>_>)
         in_RDI.super___uniq_ptr_impl<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>.
         _M_t.super__Tuple_impl<0UL,_wabt::BrTableExpr_*,_std::default_delete<wabt::BrTableExpr>_>.
         super__Head_base<0UL,_wabt::BrTableExpr_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}